

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ClockingDeclarationSyntax::getChild(ClockingDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff48;
  Info *in_stack_ffffffffffffff50;
  nullptr_t in_stack_ffffffffffffff58;
  ConstTokenOrSyntax *in_stack_ffffffffffffff60;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff50;
    token._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x46b1be,token);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff50;
    token_00._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x46b1fa,token_00);
    break;
  case 3:
    token_01.info = in_stack_ffffffffffffff50;
    token_01._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x46b230,token_01);
    break;
  case 4:
    token_02.info = in_stack_ffffffffffffff50;
    token_02._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x46b266,token_02);
    break;
  case 5:
    not_null<slang::syntax::EventExpressionSyntax_*>::get
              ((not_null<slang::syntax::EventExpressionSyntax_*> *)(in_RSI + 0x90));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 6:
    token_03.info = in_stack_ffffffffffffff50;
    token_03._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x46b2bf,token_03);
    break;
  case 7:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0xa8),in_stack_ffffffffffffff48);
    break;
  case 8:
    token_04.info = in_stack_ffffffffffffff50;
    token_04._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x46b332,token_04);
    break;
  case 9:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax ClockingDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return globalOrDefault;
        case 2: return clocking;
        case 3: return blockName;
        case 4: return at;
        case 5: return event.get();
        case 6: return semi;
        case 7: return &items;
        case 8: return endClocking;
        case 9: return endBlockName;
        default: return nullptr;
    }
}